

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
          (View<TestType,_true,_std::allocator<unsigned_long>_> *this)

{
  bool bVar1;
  size_t sVar2;
  CoordinateOrder *pCVar3;
  size_t sVar4;
  ulong local_48;
  size_t j_3;
  size_t j_2;
  size_t tmp_1;
  size_t j_1;
  size_t tmp;
  size_t j;
  size_t testSize;
  View<TestType,_true,_std::allocator<unsigned_long>_> *this_local;
  
  sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension(&this->geometry_);
  if (sVar2 == 0) {
    bVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::isSimple(&this->geometry_);
    marray_detail::Assert<bool>(bVar1);
    if (this->data_ != (pointer)0x0) {
      sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::size(&this->geometry_);
      marray_detail::Assert<bool>(sVar2 == 1);
    }
  }
  else {
    marray_detail::Assert<bool>(this->data_ != (pointer)0x0);
    j = 1;
    for (tmp = 0; sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                                    (&this->geometry_), tmp < sVar2; tmp = tmp + 1) {
      sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(&this->geometry_,tmp);
      j = sVar2 * j;
    }
    sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::size(&this->geometry_);
    marray_detail::Assert<bool>(sVar2 == j);
    pCVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                       (&this->geometry_);
    if (*pCVar3 == FirstMajorOrder) {
      j_1 = 1;
      for (tmp_1 = 0;
          sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                            (&this->geometry_), tmp_1 < sVar2; tmp_1 = tmp_1 + 1) {
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension(&this->geometry_)
        ;
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                          (&this->geometry_,(sVar2 - tmp_1) - 1);
        marray_detail::Assert<bool>(sVar2 == j_1);
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension(&this->geometry_)
        ;
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                          (&this->geometry_,(sVar2 - tmp_1) - 1);
        j_1 = sVar2 * j_1;
      }
    }
    else {
      j_2 = 1;
      for (j_3 = 0; sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                                      (&this->geometry_), j_3 < sVar2; j_3 = j_3 + 1) {
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                          (&this->geometry_,j_3);
        marray_detail::Assert<bool>(sVar2 == j_2);
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(&this->geometry_,j_3)
        ;
        j_2 = sVar2 * j_2;
      }
    }
    bVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::isSimple(&this->geometry_);
    if (bVar1) {
      for (local_48 = 0;
          sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::dimension
                            (&this->geometry_), local_48 < sVar2; local_48 = local_48 + 1) {
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                          (&this->geometry_,local_48);
        sVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                          (&this->geometry_,local_48);
        marray_detail::Assert<bool>(sVar2 == sVar4);
      }
    }
  }
  return;
}

Assistant:

inline void
View<T, isConst, A>::testInvariant() const
{
    if(!MARRAY_NO_DEBUG) {
        if(geometry_.dimension() == 0) {
            marray_detail::Assert(geometry_.isSimple() == true);
            if(data_ != 0) { // scalar
                marray_detail::Assert(geometry_.size() == 1);
            }
        }
        else {
            marray_detail::Assert(data_ != 0);

            // test size_ to be consistent with shape_
            std::size_t testSize = 1;
            for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                testSize *= geometry_.shape(j);
            }
            marray_detail::Assert(geometry_.size() == testSize);

            // test shapeStrides_ to be consistent with shape_
            if(geometry_.coordinateOrder() == FirstMajorOrder) {
                std::size_t tmp = 1;
                for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                    marray_detail::Assert(geometry_.shapeStrides(geometry_.dimension()-j-1) == tmp);
                    tmp *= geometry_.shape(geometry_.dimension()-j-1);
                }
            }
            else {
                std::size_t tmp = 1;
                for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                    marray_detail::Assert(geometry_.shapeStrides(j) == tmp);
                    tmp *= geometry_.shape(j);
                }
            }

            // test the simplicity condition 
            if(geometry_.isSimple()) {
                for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                    marray_detail::Assert(geometry_.strides(j) == geometry_.shapeStrides(j));
                }
            }
        }
    }
}